

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChFunctionRotation::Get_a_loc
          (ChVector<double> *__return_storage_ptr__,ChFunctionRotation *this,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ChQuaternion<double> q2;
  ChQuaternion<double> q1;
  ChQuaternion<double> q0;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  (*this->_vptr_ChFunctionRotation[3])(s + -1e-07,&local_48);
  (*this->_vptr_ChFunctionRotation[3])(s,&local_68,this);
  (*this->_vptr_ChFunctionRotation[3])(s + 1e-07,&local_88,this);
  local_68 = local_68 + local_68;
  local_58 = local_58 + local_58;
  local_50 = local_50 + local_50;
  dVar1 = ((local_48 - local_68) + local_88) * 100000000000000.02;
  dVar2 = ((local_40 - (local_60 + local_60)) + local_80) * 100000000000000.02;
  dVar3 = ((local_38 - local_58) + local_78) * 100000000000000.02;
  dVar4 = ((local_30 - local_50) + local_70) * 100000000000000.02;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_60 + local_60;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_68 * dVar2;
  auVar17 = vfnmadd231sd_fma(auVar17,auVar7,auVar11);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_50;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar3;
  auVar17 = vfmadd231sd_fma(auVar17,auVar10,auVar13);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_58;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar4;
  auVar5 = vfnmadd231sd_fma(auVar17,auVar8,auVar15);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2 * local_50;
  auVar17 = vfnmsub231sd_fma(auVar18,auVar8,auVar11);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_68;
  auVar17 = vfmadd231sd_fma(auVar17,auVar6,auVar13);
  auVar17 = vfmadd231sd_fma(auVar17,auVar7,auVar15);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_58 * dVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1;
  auVar8 = vfnmadd231sd_fma(auVar9,auVar10,auVar12);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar3;
  auVar8 = vfnmadd231sd_fma(auVar8,auVar7,auVar14);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar4;
  auVar8 = vfmadd231sd_fma(auVar8,auVar6,auVar16);
  __return_storage_ptr__->m_data[0] = auVar5._0_8_;
  __return_storage_ptr__->m_data[1] = auVar17._0_8_;
  __return_storage_ptr__->m_data[2] = auVar8._0_8_;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChFunctionRotation::Get_a_loc(double s) const {
		ChQuaternion<> q0 = Get_q(s - BDF_STEP_LOW);
		ChQuaternion<> q1 = Get_q(s);
		ChQuaternion<> q2 = Get_q(s + BDF_STEP_LOW);
		ChQuaternion<> qdtdt = (q0 - q1*2.0 + q2) / (BDF_STEP_LOW*BDF_STEP_LOW);
		ChGlMatrix34<> Gl(q1);
        return Gl * qdtdt;
}